

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationPart.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::SeparationPart::Decode(SeparationPart *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  SeparationPart *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x10) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,&(this->super_VariableParameter).m_ui8VarParamType);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8Reason);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8PreEntIndicator);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8Padding);
  pKVar2 = operator>>(pKVar2,(DataTypeBase *)&this->m_ParentEntId);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Padding);
  operator>>(pKVar2,&(this->m_StationLoc).super_DataTypeBase);
  return;
}

Assistant:

void SeparationPart::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < VariableParameter::VARIABLE_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8VarParamType
           >> m_ui8Reason
           >> m_ui8PreEntIndicator
           >> m_ui8Padding
           >> KDIS_STREAM m_ParentEntId
           >> m_ui16Padding
           >> KDIS_STREAM m_StationLoc;
}